

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

NULLCRef *
GetExecutorResultObject
          (NULLCRef *__return_storage_ptr__,uint tempStackType,uint *tempStackArrayBase)

{
  NULLCRef ptr;
  float *pfVar1;
  
  if (tempStackType == 0xd) {
    *(uint *)((long)&__return_storage_ptr__->ptr + 4) = tempStackArrayBase[2];
    *(undefined8 *)__return_storage_ptr__ = *(undefined8 *)tempStackArrayBase;
  }
  else if (tempStackType == 6) {
    __return_storage_ptr__->typeID = 6;
    pfVar1 = (float *)nullcAllocateTyped(6);
    __return_storage_ptr__->ptr = (char *)pfVar1;
    *pfVar1 = (float)*(double *)tempStackArrayBase;
  }
  else if (tempStackType == 0) {
    *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
    *(undefined8 *)__return_storage_ptr__ = 0;
  }
  else {
    ptr.ptr._0_4_ = (int)tempStackArrayBase;
    ptr.typeID = tempStackType;
    ptr.ptr._4_4_ = (int)((ulong)tempStackArrayBase >> 0x20);
    NULLC::CopyObject(ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef GetExecutorResultObject(unsigned tempStackType, unsigned *tempStackArrayBase)
{
	if(tempStackType == NULLC_TYPE_VOID)
	{
		NULLCRef result = { 0, 0 };

		return result;
	}
	else if(tempStackType == NULLC_TYPE_FLOAT)
	{
		// 'float' is placed as a 'double' value on the stack
		NULLCRef result = { NULLC_TYPE_FLOAT, (char*)nullcAllocateTyped(NULLC_TYPE_FLOAT) };

		double tmpDouble;
		memcpy(&tmpDouble, tempStackArrayBase, sizeof(tmpDouble));

		float tmpFloat = float(tmpDouble);
		memcpy(result.ptr, &tmpFloat, sizeof(tmpFloat));

		return result;
	}
	else if(tempStackType == NULLC_TYPE_AUTO_REF)
	{
		// Return 'auto ref' as is
		NULLCRef result;
		memcpy(&result, tempStackArrayBase, sizeof(result));

		return result;
	}

	NULLCRef tmp = { tempStackType, (char*)tempStackArrayBase };

	return NULLC::CopyObject(tmp);
}